

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.h
# Opt level: O2

uint32 __thiscall
google::protobuf::internal::ReflectionSchema::HasBitIndex
          (ReflectionSchema *this,FieldDescriptor *field)

{
  uint32 *puVar1;
  LogMessage *other;
  char *pcVar2;
  int in_EDX;
  int extraout_EDX;
  LogFinisher local_51;
  LogMessage local_50;
  
  other = (LogMessage *)field;
  if (this->has_bits_offset_ == -1) {
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.h"
               ,0xa0);
    other = LogMessage::operator<<(&local_50,"CHECK failed: HasHasbits(): ");
    LogFinisher::operator=(&local_51,other);
    LogMessage::~LogMessage(&local_50);
    in_EDX = extraout_EDX;
  }
  puVar1 = this->has_bit_indices_;
  pcVar2 = FieldDescriptor::index(field,(char *)other,in_EDX);
  return puVar1[(int)pcVar2];
}

Assistant:

uint32 HasBitIndex(const FieldDescriptor* field) const {
    GOOGLE_DCHECK(HasHasbits());
    return has_bit_indices_[field->index()];
  }